

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,EdupBuf *pEdupBuf)

{
  uint uVar1;
  int iVar2;
  Expr *pOwner;
  size_t sVar3;
  Select *pSVar4;
  Window *pWVar5;
  Expr *pEVar6;
  uint uVar7;
  EdupBuf *pEdupBuf_00;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  EdupBuf local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.zAlloc = &DAT_aaaaaaaaaaaaaaaa;
  if (pEdupBuf == (EdupBuf *)0x0) {
    if (dupFlags == 0) {
      iVar2 = 0x48;
      uVar10 = 0;
      if (((p->flags & 0x800) == 0) && (uVar10 = 0, (p->u).zToken != (char *)0x0)) {
        sVar3 = strlen((p->u).zToken);
        uVar10 = ((uint)sVar3 & 0x3fffffff) + 1;
        iVar2 = ((uint)sVar3 & 0x3ffffff8) + 0x50;
      }
    }
    else {
      iVar2 = dupedExprSize(p);
      uVar10 = 0xffffffff;
    }
    pOwner = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar2);
    uVar1 = 0;
  }
  else {
    pOwner = (Expr *)pEdupBuf->zAlloc;
    uVar1 = 0x8000000;
    uVar10 = 0xffffffff;
  }
  local_40.zAlloc = &pOwner->op;
  if (pOwner == (Expr *)0x0) goto LAB_0017f935;
  uVar8 = 0x48;
  if (((dupFlags != 0) && ((p->flags & 0x20000) == 0)) && (uVar8 = 0x402c, p->pLeft == (Expr *)0x0))
  {
    uVar8 = 0x402c;
    if ((p->x).pList == (ExprList *)0x0) {
      uVar8 = 0x10010;
    }
  }
  if ((((int)uVar10 < 0) && (uVar10 = 0, (p->flags & 0x800) == 0)) && ((p->u).zToken != (char *)0x0)
     ) {
    sVar3 = strlen((p->u).zToken);
    uVar10 = ((uint)sVar3 & 0x3fffffff) + 1;
  }
  if (dupFlags == 0) {
    uVar9 = 0x48;
    uVar7 = 0x2c;
    if ((p->flags >> 0xe & 1) == 0) {
      uVar7 = 0x48;
    }
    sVar3 = 0x10;
    if ((p->flags >> 0x10 & 1) == 0) {
      sVar3 = (size_t)uVar7;
    }
    memcpy(pOwner,p,sVar3);
    if ((uint)sVar3 < 0x48) {
      memset(local_40.zAlloc + sVar3,0,0x48 - sVar3);
    }
  }
  else {
    uVar9 = uVar8 & 0x7c;
    memcpy(pOwner,p,(ulong)uVar9);
  }
  pOwner->flags = uVar8 & 0x14000 | uVar1 | pOwner->flags & 0xf7febfff;
  if (0 < (int)uVar10) {
    (pOwner->u).zToken = (char *)(local_40.zAlloc + uVar9);
    memcpy(local_40.zAlloc + uVar9,(p->u).zToken,(ulong)uVar10);
    uVar9 = uVar9 + uVar10;
  }
  local_40.zAlloc = local_40.zAlloc + (uVar9 + 7 & 0xfffffff8);
  if (((pOwner->flags | p->flags) & 0x810000) != 0) goto LAB_0017f935;
  if ((p->flags >> 0xc & 1) == 0) {
    iVar2 = 0;
    if (p->op != 0x92) {
      iVar2 = dupFlags;
    }
    pSVar4 = (Select *)sqlite3ExprListDup(db,(p->x).pList,iVar2);
  }
  else {
    pSVar4 = sqlite3SelectDup(db,(Select *)(p->x).pList,dupFlags);
  }
  (pOwner->x).pList = (ExprList *)pSVar4;
  if ((p->flags & 0x1000000) != 0) {
    pWVar5 = sqlite3WindowDup(db,pOwner,(p->y).pWin);
    (pOwner->y).pWin = pWVar5;
  }
  pEVar6 = p->pLeft;
  if (dupFlags == 0) {
    if (p->op != 0xb2) {
      if (pEVar6 == (Expr *)0x0) {
        pEVar6 = (Expr *)0x0;
      }
      else {
        pEVar6 = exprDup(db,pEVar6,0,(EdupBuf *)0x0);
      }
    }
    pOwner->pLeft = pEVar6;
    pEVar6 = p->pRight;
    if (pEVar6 != (Expr *)0x0) {
      iVar2 = 0;
      pEdupBuf_00 = (EdupBuf *)0x0;
      goto LAB_0017f927;
    }
LAB_0017f92e:
    pEVar6 = (Expr *)0x0;
  }
  else {
    if (p->op != 0xb2) {
      if (pEVar6 == (Expr *)0x0) {
        pEVar6 = (Expr *)0x0;
      }
      else {
        pEVar6 = exprDup(db,pEVar6,1,&local_40);
      }
    }
    pOwner->pLeft = pEVar6;
    pEVar6 = p->pRight;
    if (pEVar6 == (Expr *)0x0) goto LAB_0017f92e;
    pEdupBuf_00 = &local_40;
    iVar2 = 1;
LAB_0017f927:
    pEVar6 = exprDup(db,pEVar6,iVar2,pEdupBuf_00);
  }
  pOwner->pRight = pEVar6;
LAB_0017f935:
  if (pEdupBuf != (EdupBuf *)0x0) {
    pEdupBuf->zAlloc = (u8 *)local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pOwner;
}

Assistant:

static Expr *exprDup(
  sqlite3 *db,          /* Database connection (for memory allocation) */
  const Expr *p,        /* Expr tree to be duplicated */
  int dupFlags,         /* EXPRDUP_REDUCE for compression.  0 if not */
  EdupBuf *pEdupBuf     /* Preallocated storage space, or NULL */
){
  Expr *pNew;           /* Value to return */
  EdupBuf sEdupBuf;     /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */
  int nToken = -1;       /* Space needed for p->u.zToken.  -1 means unknown */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pEdupBuf==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pEdupBuf ){
    sEdupBuf.zAlloc = pEdupBuf->zAlloc;
#ifdef SQLITE_DEBUG
    sEdupBuf.zEnd = pEdupBuf->zEnd;
#endif
    staticFlag = EP_Static;
    assert( sEdupBuf.zAlloc!=0 );
    assert( dupFlags==EXPRDUP_REDUCE );
  }else{
    int nAlloc;
    if( dupFlags ){
      nAlloc = dupedExprSize(p);
    }else if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30NN(p->u.zToken)+1;
      nAlloc = ROUND8(EXPR_FULLSIZE + nToken);
    }else{
      nToken = 0;
      nAlloc = ROUND8(EXPR_FULLSIZE);
    }
    assert( nAlloc==ROUND8(nAlloc) );
    sEdupBuf.zAlloc = sqlite3DbMallocRawNN(db, nAlloc);
#ifdef SQLITE_DEBUG
    sEdupBuf.zEnd = sEdupBuf.zAlloc ? sEdupBuf.zAlloc+nAlloc : 0;
#endif

    staticFlag = 0;
  }
  pNew = (Expr *)sEdupBuf.zAlloc;
  assert( EIGHT_BYTE_ALIGNMENT(pNew) );

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    int nNewSize = nStructSize & 0xfff;
    if( nToken<0 ){
      if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
        nToken = sqlite3Strlen30(p->u.zToken) + 1;
      }else{
        nToken = 0;
      }
    }
    if( dupFlags ){
      assert( (int)(sEdupBuf.zEnd - sEdupBuf.zAlloc) >= nNewSize+nToken );
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(sEdupBuf.zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      assert( (int)(sEdupBuf.zEnd - sEdupBuf.zAlloc) >=
                                                   (int)EXPR_FULLSIZE+nToken );
      memcpy(sEdupBuf.zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){
        memset(&sEdupBuf.zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
      nNewSize = EXPR_FULLSIZE;
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;
    ExprClearVVAProperties(pNew);
    if( dupFlags ){
      ExprSetVVAProperty(pNew, EP_Immutable);
    }

    /* Copy the p->u.zToken string, if any. */
    assert( nToken>=0 );
    if( nToken>0 ){
      char *zToken = pNew->u.zToken = (char*)&sEdupBuf.zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
      nNewSize += nToken;
    }
    sEdupBuf.zAlloc += ROUND8(nNewSize);

    if( ((p->flags|pNew->flags)&(EP_TokenOnly|EP_Leaf))==0 ){

      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprUseXSelect(p) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList,
                           p->op!=TK_ORDER ? dupFlags : 0);
      }

#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_WinFunc) ){
        pNew->y.pWin = sqlite3WindowDup(db, pNew, p->y.pWin);
        assert( ExprHasProperty(pNew, EP_WinFunc) );
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */

      /* Fill in pNew->pLeft and pNew->pRight. */
      if( dupFlags ){
        if( p->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->pRight==0
               || p->pRight==p->pLeft
               || ExprHasProperty(p->pLeft, EP_Subquery) );
        }else{
          pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &sEdupBuf) : 0;
        }
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &sEdupBuf) : 0;
      }else{
        if( p->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->pRight==0
               || p->pRight==p->pLeft
               || ExprHasProperty(p->pLeft, EP_Subquery) );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
  }
  if( pEdupBuf ) memcpy(pEdupBuf, &sEdupBuf, sizeof(sEdupBuf));
  assert( sEdupBuf.zAlloc <= sEdupBuf.zEnd );
  return pNew;
}